

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
determineIfBoundaryNodes
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ImportedUgrid *ugrid)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  int local_48;
  int n_1;
  int i_1;
  int q;
  int n;
  int i;
  int t;
  allocator<int> local_25;
  value_type_conflict1 local_24;
  undefined1 local_1d;
  int local_1c;
  ImportedUgrid *pIStack_18;
  int nnodes;
  ImportedUgrid *ugrid_local;
  vector<int,_std::allocator<int>_> *is_boundary;
  
  pIStack_18 = ugrid;
  ugrid_local = (ImportedUgrid *)__return_storage_ptr__;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&ugrid->nodes);
  local_1c = (int)(sVar1 / 3);
  local_1d = 0;
  sVar1 = (size_type)local_1c;
  local_24 = 0;
  std::allocator<int>::allocator(&local_25);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,sVar1,&local_24,&local_25);
  std::allocator<int>::~allocator(&local_25);
  for (n = 0; sVar1 = std::vector<int,_std::allocator<int>_>::size(&pIStack_18->triangles),
      (ulong)(long)n < sVar1 / 3; n = n + 1) {
    for (q = 0; q < 3; q = q + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&pIStack_18->triangles,(long)(n * 3 + q));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,(long)*pvVar2);
      *pvVar3 = 1;
    }
  }
  for (n_1 = 0; sVar1 = std::vector<int,_std::allocator<int>_>::size(&pIStack_18->quads),
      (ulong)(long)n_1 < sVar1 >> 2; n_1 = n_1 + 1) {
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&pIStack_18->quads,(long)(n_1 * 4 + local_48));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (__return_storage_ptr__,(long)*pvVar2);
      *pvVar3 = 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> determineIfBoundaryNodes(const Parfait::ImportedUgrid& ugrid){
    int nnodes = ugrid.nodes.size()/3;
    std::vector<int> is_boundary(nnodes, 0);
    for(int t = 0; t < ugrid.triangles.size() /3; t++){
        for(int i = 0; i < 3; i++){
            int n = ugrid.triangles[3*t+i];
            is_boundary[n] = 1;
        }
    }
    for(int q = 0; q < ugrid.quads.size() /4; q++){
        for(int i = 0; i < 4; i++){
            int n = ugrid.quads[4*q+i];
            is_boundary[n] = 1;
        }
    }
    return is_boundary;
}